

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>*>
          (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this,
          int *args,holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> **args_1)

{
  __int_type_conflict _Var1;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *phVar2;
  proxy *in_RDX;
  new_allocator<cs_impl::any::proxy> *in_RSI;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> **in_RDI;
  proxy *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x201] != (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *)0x0) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var1 == 0) {
      phVar2 = in_RDI[0x201];
      in_RDI[0x201] =
           (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *)
           ((long)&phVar2[-1].mDat.super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                   _M_impl.super__Deque_impl_data._M_finish._M_node + 7);
      phVar2 = in_RDI[(long)((long)&phVar2[-1].mDat.
                                    super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node + 7)];
      goto LAB_0016db04;
    }
  }
  phVar2 = (holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *)
           __gnu_cxx::new_allocator<cs_impl::any::proxy>::allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_0016db04:
  __gnu_cxx::new_allocator<cs_impl::any::proxy>::
  construct<cs_impl::any::proxy,int,cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>*>
            (in_RSI,in_RDX,(int *)phVar2,in_RDI);
  return (proxy *)phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}